

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> *
HuffmanArchiver::get_full_code
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<bool,_std::allocator<bool>_> *code,int length)

{
  uint uVar1;
  ulong *puVar2;
  _Bit_type *p_Var3;
  byte bVar4;
  undefined8 in_RAX;
  ulong uVar5;
  ulong *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auStack_38 [7];
  bool local_31;
  
  _auStack_38 = CONCAT17(1,SUB87(in_RAX,0));
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)length,&local_31,(allocator_type *)(auStack_38 + 6));
  std::__reverse<std::_Bit_iterator>
            ((code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p,0,
             (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p,
             (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset);
  puVar6 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar1 == 0 && puVar6 == puVar2) {
    uVar5 = 0;
  }
  else {
    p_Var3 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar9 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar9 = uVar5;
      }
      lVar11 = (long)uVar9 >> 6;
      uVar9 = (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001);
      uVar10 = 1L << ((byte)uVar5 & 0x3f);
      if ((*puVar6 >> (uVar8 & 0x3f) & 1) == 0) {
        uVar10 = ~uVar10 & p_Var3[lVar11 + uVar9 + 0xffffffffffffffff];
      }
      else {
        uVar10 = uVar10 | p_Var3[lVar11 + uVar9 + 0xffffffffffffffff];
      }
      p_Var3[lVar11 + uVar9 + 0xffffffffffffffff] = uVar10;
      uVar5 = uVar5 + 1;
      iVar7 = (int)uVar8;
      puVar6 = puVar6 + (iVar7 == 0x3f);
      uVar8 = (ulong)(iVar7 + 1);
      if (iVar7 == 0x3f) {
        uVar8 = 0;
      }
    } while ((uint)uVar8 != uVar1 || puVar6 != puVar2);
  }
  uVar8 = uVar5 + 0x3f;
  if (-1 < (long)uVar5) {
    uVar8 = uVar5;
  }
  bVar4 = (byte)uVar5 & 0x3f;
  puVar6 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)uVar8 >> 6) +
           (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar6 = *puVar6 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> HuffmanArchiver::get_full_code(std::vector<bool> code, int length) {
    std::vector<bool> res(length, true);
    std::size_t i = 0;
    std::reverse(code.begin(), code.end());
    for (bool bit : code) {
        res[i] = bit;
        i++;
    }
    res[i] = false;
    return res;
}